

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O0

size_t __thiscall
Js::StackTraceHelper::PrintStackTrace
          (StackTraceHelper *this,ULONG framesToSkip,ULONG framesToCapture)

{
  StackBackTrace *this_00;
  size_t sVar1;
  StackBackTrace *stackTrace;
  ULONG local_18;
  AutoNestedHandledExceptionType autoNestedHandledExceptionType;
  ULONG framesToCapture_local;
  ULONG framesToSkip_local;
  StackTraceHelper *this_local;
  
  local_18 = framesToCapture;
  autoNestedHandledExceptionType.savedData.handledExceptionType = (Data)(Data)framesToSkip;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&stackTrace + 4),ExceptionType_DisableCheck);
  this_00 = GetStackBackTrace(this,local_18);
  StackBackTrace::Capture
            (this_00,(ULONG)autoNestedHandledExceptionType.savedData.handledExceptionType);
  sVar1 = StackBackTrace::Print(this_00);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&stackTrace + 4));
  return sVar1;
}

Assistant:

size_t StackTraceHelper::PrintStackTrace(ULONG framesToSkip, ULONG framesToCapture)
    {
#ifdef EXCEPTION_CHECK
        AutoNestedHandledExceptionType autoNestedHandledExceptionType(ExceptionType_DisableCheck);
#endif
        StackBackTrace* stackTrace = this->GetStackBackTrace(framesToCapture);
        stackTrace->Capture(framesToSkip);
        return stackTrace->Print();
    }